

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_struct(t_dart_generator *this,t_struct *tstruct,bool is_exception)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  ostream *poVar4;
  int __oflag;
  string local_358;
  string local_338;
  string local_318 [8];
  string imports;
  string local_2d8;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [32];
  undefined1 local_270 [8];
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string f_struct_name;
  string local_60;
  undefined1 local_40 [8];
  string file_name;
  bool is_exception_local;
  t_struct *tstruct_local;
  t_dart_generator *this_local;
  
  file_name.field_2._M_local_buf[0xf] = is_exception;
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_60,(string *)CONCAT44(extraout_var,iVar2));
  get_file_name((string *)local_40,this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_struct.field_0x198,&this->src_dir_,"/");
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_struct.field_0x198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0,".dart");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&f_struct.field_0x198);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_270);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,pcVar3,&local_291);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_270,(char *)local_290,__oflag);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(local_2b8);
  poVar4 = std::operator<<((ostream *)local_270,local_2b8);
  std::__cxx11::string::string((string *)(imports.field_2._M_local_buf + 8),(string *)local_40);
  dart_library(&local_2d8,this,(string *)((long)&imports.field_2 + 8));
  poVar4 = std::operator<<(poVar4,(string *)&local_2d8);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)(imports.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::string(local_318);
  dart_thrift_imports_abi_cxx11_(&local_338,this);
  poVar4 = std::operator<<((ostream *)local_270,(string *)&local_338);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_338);
  uVar1 = file_name.field_2._M_local_buf[0xf];
  std::__cxx11::string::string((string *)&local_358,(string *)local_40);
  poVar4 = (ostream *)local_270;
  generate_dart_struct_definition(this,poVar4,tstruct,(bool)(uVar1 & 1),false,&local_358);
  iVar2 = (int)poVar4;
  std::__cxx11::string::~string((string *)&local_358);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_270,iVar2);
  std::__cxx11::string::~string(local_318);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_270);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct(t_struct* tstruct, bool is_exception) {
  string file_name = get_file_name(tstruct->get_name());
  string f_struct_name = src_dir_ + "/" + file_name + ".dart";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << dart_library(file_name) << endl;

  string imports;

  f_struct << dart_thrift_imports() << endl;

  generate_dart_struct_definition(f_struct, tstruct, is_exception, false, file_name);

  f_struct.close();
}